

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall JSON::Node::Node(Node *this,string *type,string *rawValue,int start,int end)

{
  std::__cxx11::string::string((string *)this,(string *)type);
  this->start = start;
  this->end = end;
  std::__cxx11::string::string((string *)&this->rawValue,(string *)rawValue);
  (this->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Node(string type, string rawValue, int start, int end)
                : type(type), rawValue(rawValue), start(start), end(end) {
        }